

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

void lws_service_do_ripe_rxflow(lws_context_per_thread *pt)

{
  lws_dll2 **wsi;
  lws_dll2 *plVar1;
  lws_dll2 *plVar2;
  int iVar3;
  lws_log_cx *cx;
  pollfd pfd;
  
  plVar1 = (pt->dll_buflist_owner).head;
  while (plVar2 = plVar1, plVar2 != (lws_dll2 *)0x0) {
    plVar1 = plVar2->next;
    wsi = &plVar2[-0x18].next;
    pfd.fd = -1;
    pfd.events = 1;
    pfd.revents = 1;
    cx = lwsl_wsi_get_cx((lws *)wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_service_do_ripe_rxflow",
                "rxflow processing: fc=%d, 0x%lx",(ulong)(*(char *)&plVar2[0x18].owner != '\0'),
                (ulong)*(uint *)((long)&plVar2[0x16].next + 4));
    if ((*(char *)&plVar2[0x18].owner == '\0') &&
       (*(short *)((long)&plVar2[0x16].next + 4) != 0x110)) {
      pt->field_0x19b = pt->field_0x19b | 2;
      iVar3 = (**(code **)((long)(plVar2[0xc].next)->owner +
                          (ulong)(*(byte *)((long)&plVar2[0xc].next[1].prev + 2) & 0xf) * 8 + -8))
                        (pt,wsi,&pfd);
      if (iVar3 == 6) {
        lws_close_free_wsi((lws *)wsi,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
      }
      pt->field_0x19b = pt->field_0x19b & 0xfd;
    }
  }
  return;
}

Assistant:

void
lws_service_do_ripe_rxflow(struct lws_context_per_thread *pt)
{
	struct lws_pollfd pfd;

	if (!pt->dll_buflist_owner.head)
		return;

	/*
	 * service all guys with pending rxflow that reached a state they can
	 * accept the pending data
	 */

	lws_pt_lock(pt, __func__);

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		pfd.events = LWS_POLLIN;
		pfd.revents = LWS_POLLIN;
		pfd.fd = -1;

		lwsl_wsi_debug(wsi, "rxflow processing: fc=%d, 0x%lx",
				    lws_is_flowcontrolled(wsi),
				    (unsigned long)wsi->wsistate);

		if (!lws_is_flowcontrolled(wsi) &&
		    lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			pt->inside_lws_service = 1;

			if (lws_rops_func_fidx(wsi->role_ops,
					       LWS_ROPS_handle_POLLIN).
						handle_POLLIN(pt, wsi, &pfd) ==
						   LWS_HPI_RET_PLEASE_CLOSE_ME)
				lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
						"close_and_handled");
			pt->inside_lws_service = 0;
		}

	} lws_end_foreach_dll_safe(d, d1);

	lws_pt_unlock(pt);
}